

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImFontAtlas::GetTexDataAsRGBA32
          (ImFontAtlas *this,uchar **out_pixels,int *out_width,int *out_height,
          int *out_bytes_per_pixel)

{
  uint *puVar1;
  int local_4c;
  uint *puStack_48;
  int n;
  uint *dst;
  uchar *src;
  uchar *pixels;
  int *out_bytes_per_pixel_local;
  int *out_height_local;
  int *out_width_local;
  uchar **out_pixels_local;
  ImFontAtlas *this_local;
  
  pixels = (uchar *)out_bytes_per_pixel;
  out_bytes_per_pixel_local = out_height;
  out_height_local = out_width;
  out_width_local = (int *)out_pixels;
  if (this->TexPixelsRGBA32 == (uint *)0x0) {
    src = (uchar *)0x0;
    out_pixels_local = (uchar **)this;
    GetTexDataAsAlpha8(this,&src,(int *)0x0,(int *)0x0,(int *)0x0);
    if (src != (uchar *)0x0) {
      puVar1 = (uint *)ImGui::MemAlloc((long)(this->TexWidth * this->TexHeight * 4));
      this->TexPixelsRGBA32 = puVar1;
      dst = (uint *)src;
      puStack_48 = this->TexPixelsRGBA32;
      for (local_4c = this->TexWidth * this->TexHeight; 0 < local_4c; local_4c = local_4c + -1) {
        *puStack_48 = (uint)(byte)*dst << 0x18 | 0xffffff;
        puStack_48 = puStack_48 + 1;
        dst = (uint *)((long)dst + 1);
      }
    }
  }
  *(uint **)out_width_local = this->TexPixelsRGBA32;
  if (out_height_local != (int *)0x0) {
    *out_height_local = this->TexWidth;
  }
  if (out_bytes_per_pixel_local != (int *)0x0) {
    *out_bytes_per_pixel_local = this->TexHeight;
  }
  if (pixels != (uchar *)0x0) {
    pixels[0] = '\x04';
    pixels[1] = '\0';
    pixels[2] = '\0';
    pixels[3] = '\0';
  }
  return;
}

Assistant:

void    ImFontAtlas::GetTexDataAsRGBA32(unsigned char** out_pixels, int* out_width, int* out_height, int* out_bytes_per_pixel)
{
    // Convert to RGBA32 format on demand
    // Although it is likely to be the most commonly used format, our font rendering is 1 channel / 8 bpp
    if (!TexPixelsRGBA32)
    {
        unsigned char* pixels = NULL;
        GetTexDataAsAlpha8(&pixels, NULL, NULL);
        if (pixels)
        {
            TexPixelsRGBA32 = (unsigned int*)ImGui::MemAlloc((size_t)(TexWidth * TexHeight * 4));
            const unsigned char* src = pixels;
            unsigned int* dst = TexPixelsRGBA32;
            for (int n = TexWidth * TexHeight; n > 0; n--)
                *dst++ = IM_COL32(255, 255, 255, (unsigned int)(*src++));
        }
    }

    *out_pixels = (unsigned char*)TexPixelsRGBA32;
    if (out_width) *out_width = TexWidth;
    if (out_height) *out_height = TexHeight;
    if (out_bytes_per_pixel) *out_bytes_per_pixel = 4;
}